

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O1

ze_result_t __thiscall
tracing_layer::APITracerImp::destroyTracer(APITracerImp *this,zel_tracer_handle_t phTracer)

{
  ze_result_t zVar1;
  
  zVar1 = APITracerContextImp::finalizeDisableImpTracingWait
                    (pGlobalAPITracerContextImp,(APITracerImp *)phTracer);
  if (phTracer != (zel_tracer_handle_t)0x0 && zVar1 == ZE_RESULT_SUCCESS) {
    (**(code **)(*(long *)phTracer + 8))(phTracer);
  }
  return zVar1;
}

Assistant:

ze_result_t APITracerImp::destroyTracer(zel_tracer_handle_t phTracer) {

    APITracerImp *tracer = static_cast<APITracerImp *>(phTracer);

    ze_result_t result =
        pGlobalAPITracerContextImp->finalizeDisableImpTracingWait(tracer);
    if (result == ZE_RESULT_SUCCESS) {
        delete tracing_layer::APITracer::fromHandle(phTracer);
    }
    return result;
}